

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O0

void __thiscall rtc::TryCritScope::~TryCritScope(TryCritScope *this)

{
  ostream *poVar1;
  FatalMessage local_190;
  FatalMessageVoidify local_11;
  TryCritScope *local_10;
  TryCritScope *this_local;
  
  local_10 = this;
  if ((this->lock_was_called_ & 1U) != 0) {
    if ((this->locked_ & 1U) != 0) {
      CriticalSection::Leave(this->cs_);
    }
    return;
  }
  FatalMessageVoidify::FatalMessageVoidify(&local_11);
  FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
             ,0xcc);
  poVar1 = FatalMessage::stream(&local_190);
  poVar1 = std::operator<<(poVar1,"Check failed: lock_was_called_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  FatalMessageVoidify::operator&(&local_11,poVar1);
  FatalMessage::~FatalMessage(&local_190);
}

Assistant:

TryCritScope::~TryCritScope() {
  CS_DEBUG_CODE(RTC_DCHECK(lock_was_called_));
  if (locked_)
    cs_->Leave();
}